

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

xmlChar * xmlURIEscapeStr(xmlChar *str,xmlChar *list)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar xVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int local_34;
  
  if (str != (xmlChar *)0x0) {
    if (*str == '\0') {
      pxVar2 = xmlStrdup(str);
      return pxVar2;
    }
    iVar1 = xmlStrlen(str);
    if (0 < iVar1) {
      pxVar2 = (xmlChar *)(*xmlMallocAtomic)((size_t)(iVar1 + 0x14));
      if (pxVar2 != (xmlChar *)0x0) {
        bVar6 = *str;
        uVar8 = 0;
        if (bVar6 != 0) {
          pxVar3 = pxVar2;
          local_34 = iVar1 + 0x14;
          do {
            iVar1 = (int)uVar8;
            pxVar2 = pxVar3;
            if (local_34 - iVar1 < 4) {
              pxVar2 = xmlSaveUriRealloc(pxVar3,&local_34);
              if (pxVar2 == (xmlChar *)0x0) {
                xmlURIErrMemory("escaping URI value\n");
                (*xmlFree)(pxVar3);
                return (xmlChar *)0x0;
              }
              bVar6 = *str;
            }
            if (((((byte)(bVar6 - 0x30) < 10) || ((byte)(bVar6 - 0x40) < 0x1b)) ||
                ((byte)(bVar6 + 0x9f) < 0x1a)) ||
               (((bVar6 - 0x21 < 0x3f &&
                 ((0x40000000000033c1U >> ((ulong)(bVar6 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar6 == 0x7e)))) {
LAB_001904b0:
              uVar7 = iVar1 + 1;
              pxVar2[iVar1] = bVar6;
            }
            else {
              pxVar3 = xmlStrchr(list,bVar6);
              if (pxVar3 != (xmlChar *)0x0) {
                bVar6 = *str;
                goto LAB_001904b0;
              }
              bVar5 = (bVar6 >> 4) + 0x37;
              if (bVar6 < 0xa0) {
                bVar5 = bVar6 >> 4 | 0x30;
              }
              pxVar2[iVar1] = '%';
              pxVar2[(long)iVar1 + 1] = bVar5;
              bVar6 = bVar6 & 0xf;
              xVar4 = bVar6 + 0x37;
              if (bVar6 < 10) {
                xVar4 = bVar6 + 0x30;
              }
              pxVar2[(long)iVar1 + 2] = xVar4;
              uVar7 = iVar1 + 3;
            }
            uVar8 = (ulong)uVar7;
            bVar6 = str[1];
            str = str + 1;
            pxVar3 = pxVar2;
          } while (bVar6 != 0);
          uVar8 = (ulong)(int)uVar7;
        }
        pxVar2[uVar8] = '\0';
        return pxVar2;
      }
      xmlURIErrMemory("escaping URI value\n");
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlURIEscapeStr(const xmlChar *str, const xmlChar *list) {
    xmlChar *ret, ch;
    xmlChar *temp;
    const xmlChar *in;
    int len, out;

    if (str == NULL)
	return(NULL);
    if (str[0] == 0)
	return(xmlStrdup(str));
    len = xmlStrlen(str);
    if (!(len > 0)) return(NULL);

    len += 20;
    ret = (xmlChar *) xmlMallocAtomic(len);
    if (ret == NULL) {
        xmlURIErrMemory("escaping URI value\n");
	return(NULL);
    }
    in = (const xmlChar *) str;
    out = 0;
    while(*in != 0) {
	if (len - out <= 3) {
            temp = xmlSaveUriRealloc(ret, &len);
	    if (temp == NULL) {
                xmlURIErrMemory("escaping URI value\n");
		xmlFree(ret);
		return(NULL);
	    }
	    ret = temp;
	}

	ch = *in;

	if ((ch != '@') && (!IS_UNRESERVED(ch)) && (!xmlStrchr(list, ch))) {
	    unsigned char val;
	    ret[out++] = '%';
	    val = ch >> 4;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    val = ch & 0xF;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    in++;
	} else {
	    ret[out++] = *in++;
	}

    }
    ret[out] = 0;
    return(ret);
}